

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O3

int E64::sdl2_process_events(void)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  bool bVar5;
  uint8_t *puVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint __c;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  bool bVar22;
  SDL_Event event;
  byte local_70;
  int local_68 [2];
  undefined4 local_60;
  undefined4 uStack_5c;
  int local_54;
  
  uVar1 = E64_sdl2_keyboard_state[0xe5];
  uVar2 = E64_sdl2_keyboard_state[0xe6];
  uVar3 = E64_sdl2_keyboard_state[0xe1];
  uVar4 = E64_sdl2_keyboard_state[0xe2];
  iVar8 = SDL_PollEvent(local_68);
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    bVar22 = uVar1 == '\0' && uVar3 == '\0';
    bVar5 = uVar1 != '\0' || uVar3 != '\0';
    uVar10 = 0x2b;
    if (bVar22) {
      uVar10 = 0x3d;
    }
    uVar11 = 0x5f;
    if (bVar22) {
      uVar11 = 0x2d;
    }
    uVar12 = 0x7e;
    if (bVar22) {
      uVar12 = 0x60;
    }
    uVar13 = 0x28;
    if (bVar22) {
      uVar13 = 0x39;
    }
    uVar14 = 0x2a;
    if (bVar22) {
      uVar14 = 0x38;
    }
    uVar15 = 0x26;
    if (bVar22) {
      uVar15 = 0x37;
    }
    uVar16 = 0x5e;
    if (bVar22) {
      uVar16 = 0x36;
    }
    uVar17 = 0x40;
    if (bVar22) {
      uVar17 = 0x32;
    }
    uVar18 = 0x29;
    if (bVar22) {
      uVar18 = 0x30;
    }
    bVar7 = bVar5 << 5;
    local_70 = bVar7 | 0x5c;
    bVar20 = bVar5 << 4;
    bVar21 = bVar22 << 5;
    bVar19 = bVar22 << 4;
    iVar8 = 0;
    do {
      if (local_68[0] < 0x300) {
        if (local_68[0] == 0x100) {
LAB_00162257:
          iVar8 = -1;
        }
        else if ((local_68[0] == 0x200) && ((char)uStack_5c == '\x05')) {
          puts("[SDL] window resize event");
        }
        goto switchD_00162292_caseD_9;
      }
      if (local_68[0] == 0x1000) {
        fd_t::insert_disk(machine.fd,(char *)CONCAT44(uStack_5c,local_60),false,false);
        SDL_free(CONCAT44(uStack_5c,local_60));
        goto switchD_00162292_caseD_9;
      }
      if (local_68[0] != 0x300) goto switchD_00162292_caseD_9;
      if (local_54 != 0x66) {
        if (local_54 == 0x40000042) {
          sdl2_wait_until_f9_released();
          machine_t::toggle_mode(&machine);
        }
        else {
          if (local_54 != 0x72 || uVar2 == '\0' && uVar4 == '\0') {
            if (local_54 == 0x71 && (uVar2 != '\0' || uVar4 != '\0')) {
              sdl2_wait_until_q_released();
              goto LAB_00162257;
            }
            goto LAB_001621f7;
          }
          sdl2_wait_until_r_released();
          machine_t::reset(&machine);
          stats_t::reset(&stats);
        }
LAB_0016224b:
        iVar8 = 1;
        goto switchD_00162292_caseD_9;
      }
      if (uVar2 != '\0' || uVar4 != '\0') {
        sdl2_wait_until_f_released();
        video_t::toggle_fullscreen(host.video);
        goto LAB_0016224b;
      }
LAB_001621f7:
      iVar8 = 1;
      if (machine.mode != MONITOR) {
        if ((machine.mode == RUNNING) && (local_54 == 0x40000043)) {
          vicv_ic::toggle_stats(machine.vicv);
        }
        goto switchD_00162292_caseD_9;
      }
      if (0x4000003a < local_54) {
        switch(local_54) {
        case 0x4000004f:
          tty_t::arrow_right(monitor.tty);
          break;
        case 0x40000050:
          tty_t::arrow_left(monitor.tty);
          break;
        case 0x40000051:
          tty_t::arrow_down(monitor.tty);
          break;
        case 0x40000052:
          tty_t::arrow_up(monitor.tty);
          break;
        default:
          if (local_54 == 0x4000003b) {
            tty_t::toggle_status_bar(monitor.tty);
          }
          else if (local_54 == 0x4000003c) {
            (monitor.tty)->status_bar_hex_view = (bool)((monitor.tty)->status_bar_hex_view ^ 1);
          }
        }
        goto switchD_00162292_caseD_9;
      }
      switch(local_54) {
      case 8:
        if (uVar1 == '\0' && uVar3 == '\0') {
          tty_t::backspace(monitor.tty);
        }
        else {
          tty_t::insert(monitor.tty);
        }
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x3a:
      case 0x3c:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5e:
      case 0x5f:
        goto switchD_00162292_caseD_9;
      case 0xd:
        tty_t::enter(monitor.tty);
        goto switchD_00162292_caseD_9;
      case 0x20:
        __c = 0x20;
        break;
      case 0x27:
        __c = (uint)bVar22 * 5 + 0x22;
        break;
      case 0x2c:
        __c = (uint)(bVar20 | 0x2c);
        break;
      case 0x2d:
        __c = uVar11;
        break;
      case 0x2e:
        __c = bVar20 + 0x2e;
        break;
      case 0x2f:
        __c = bVar20 + 0x2f;
        break;
      case 0x30:
        __c = uVar18;
        break;
      case 0x31:
        __c = (uint)(bVar19 | 0x21);
        break;
      case 0x32:
        __c = uVar17;
        break;
      case 0x33:
        __c = bVar19 + 0x23;
        break;
      case 0x34:
        __c = bVar19 + 0x24;
        break;
      case 0x35:
        __c = bVar19 + 0x25;
        break;
      case 0x36:
        __c = uVar16;
        break;
      case 0x37:
        __c = uVar15;
        break;
      case 0x38:
        __c = uVar14;
        break;
      case 0x39:
        __c = uVar13;
        break;
      case 0x3b:
        __c = bVar22 + 0x3a;
        break;
      case 0x3d:
        __c = uVar10;
        break;
      case 0x5b:
        __c = bVar7 + 0x5b;
        break;
      case 0x5c:
        __c = (uint)local_70;
        break;
      case 0x5d:
        __c = bVar7 + 0x5d;
        break;
      case 0x60:
        __c = uVar12;
        break;
      case 0x61:
        __c = (uint)(bVar21 | 0x41);
        break;
      case 0x62:
        __c = bVar21 + 0x42;
        break;
      case 99:
        __c = bVar21 + 0x43;
        break;
      case 100:
        __c = bVar21 + 0x44;
        break;
      case 0x65:
        __c = bVar21 + 0x45;
        break;
      case 0x66:
        __c = bVar21 + 0x46;
        break;
      case 0x67:
        __c = bVar21 + 0x47;
        break;
      case 0x68:
        __c = bVar21 + 0x48;
        break;
      case 0x69:
        __c = bVar21 + 0x49;
        break;
      case 0x6a:
        __c = bVar21 + 0x4a;
        break;
      case 0x6b:
        __c = bVar21 + 0x4b;
        break;
      case 0x6c:
        __c = bVar21 + 0x4c;
        break;
      case 0x6d:
        __c = bVar21 + 0x4d;
        break;
      case 0x6e:
        __c = bVar21 + 0x4e;
        break;
      case 0x6f:
        __c = bVar21 + 0x4f;
        break;
      case 0x70:
        __c = bVar21 + 0x50;
        break;
      case 0x71:
        __c = bVar21 + 0x51;
        break;
      case 0x72:
        __c = bVar21 + 0x52;
        break;
      case 0x73:
        __c = bVar21 + 0x53;
        break;
      case 0x74:
        __c = bVar21 + 0x54;
        break;
      case 0x75:
        __c = bVar21 + 0x55;
        break;
      case 0x76:
        __c = bVar21 + 0x56;
        break;
      case 0x77:
        __c = bVar21 + 0x57;
        break;
      case 0x78:
        __c = bVar21 + 0x58;
        break;
      case 0x79:
        __c = bVar21 + 0x59;
        break;
      case 0x7a:
        __c = bVar21 + 0x5a;
        break;
      default:
        if ((local_54 == 0x4000003a) &&
           (command_t::single_step_cpu(monitor.command), (monitor.tty)->status_bar_active == false))
        {
          tty_t::cursor_deactivate(monitor.tty);
          command_t::dump_cpu_status(monitor.command);
          tty_t::prompt(monitor.tty);
          tty_t::cursor_activate(monitor.tty);
        }
        goto switchD_00162292_caseD_9;
      }
      tty_t::putchar(monitor.tty,__c);
switchD_00162292_caseD_9:
      iVar9 = SDL_PollEvent(local_68);
    } while (iVar9 != 0);
  }
  puVar6 = E64_sdl2_keyboard_state;
  if (uVar2 == '\0' && uVar4 == '\0') {
    (machine.cia)->keys_last_known_state[1] = E64_sdl2_keyboard_state[0x29] != '\0';
    (machine.cia)->keys_last_known_state[2] = puVar6[0x3a] != '\0';
    (machine.cia)->keys_last_known_state[3] = puVar6[0x3b] != '\0';
    (machine.cia)->keys_last_known_state[4] = puVar6[0x3c] != '\0';
    (machine.cia)->keys_last_known_state[5] = puVar6[0x3d] != '\0';
    (machine.cia)->keys_last_known_state[6] = puVar6[0x3e] != '\0';
    (machine.cia)->keys_last_known_state[7] = puVar6[0x3f] != '\0';
    (machine.cia)->keys_last_known_state[8] = puVar6[0x40] != '\0';
    (machine.cia)->keys_last_known_state[9] = puVar6[0x41] != '\0';
    (machine.cia)->keys_last_known_state[10] =
         puVar6[0x35] != '\0' | (machine.cia)->registers[10] * '\x02';
    (machine.cia)->keys_last_known_state[0xb] = puVar6[0x1e] != '\0';
    (machine.cia)->keys_last_known_state[0xc] = puVar6[0x1f] != '\0';
    (machine.cia)->keys_last_known_state[0xd] = puVar6[0x20] != '\0';
    (machine.cia)->keys_last_known_state[0xe] = puVar6[0x21] != '\0';
    (machine.cia)->keys_last_known_state[0xf] = puVar6[0x22] != '\0';
    (machine.cia)->keys_last_known_state[0x10] = puVar6[0x23] != '\0';
    (machine.cia)->keys_last_known_state[0x11] = puVar6[0x24] != '\0';
    (machine.cia)->keys_last_known_state[0x12] = puVar6[0x25] != '\0';
    (machine.cia)->keys_last_known_state[0x13] = puVar6[0x26] != '\0';
    (machine.cia)->keys_last_known_state[0x14] = puVar6[0x27] != '\0';
    (machine.cia)->keys_last_known_state[0x15] = puVar6[0x2d] != '\0';
    (machine.cia)->keys_last_known_state[0x16] = puVar6[0x2e] != '\0';
    (machine.cia)->keys_last_known_state[0x17] = puVar6[0x2a] != '\0';
    (machine.cia)->keys_last_known_state[0x18] = puVar6[0x2b] != '\0';
    (machine.cia)->keys_last_known_state[0x19] = puVar6[0x14] != '\0';
    (machine.cia)->keys_last_known_state[0x1a] = puVar6[0x1a] != '\0';
    (machine.cia)->keys_last_known_state[0x1b] = puVar6[8] != '\0';
    (machine.cia)->keys_last_known_state[0x1c] = puVar6[0x15] != '\0';
    (machine.cia)->keys_last_known_state[0x1d] = puVar6[0x17] != '\0';
    (machine.cia)->keys_last_known_state[0x1e] = puVar6[0x1c] != '\0';
    (machine.cia)->keys_last_known_state[0x1f] = puVar6[0x18] != '\0';
    (machine.cia)->keys_last_known_state[0x20] = puVar6[0xc] != '\0';
    (machine.cia)->keys_last_known_state[0x21] = puVar6[0x12] != '\0';
    (machine.cia)->keys_last_known_state[0x22] = puVar6[0x13] != '\0';
    (machine.cia)->keys_last_known_state[0x23] = puVar6[0x2f] != '\0';
    (machine.cia)->keys_last_known_state[0x24] = puVar6[0x30] != '\0';
    (machine.cia)->keys_last_known_state[0x25] = puVar6[0x28] != '\0';
    (machine.cia)->keys_last_known_state[0x26] = puVar6[4] != '\0';
    (machine.cia)->keys_last_known_state[0x27] = puVar6[0x16] != '\0';
    (machine.cia)->keys_last_known_state[0x28] = puVar6[7] != '\0';
    (machine.cia)->keys_last_known_state[0x29] = puVar6[9] != '\0';
    (machine.cia)->keys_last_known_state[0x2a] = puVar6[10] != '\0';
    (machine.cia)->keys_last_known_state[0x2b] = puVar6[0xb] != '\0';
    (machine.cia)->keys_last_known_state[0x2c] = puVar6[0xd] != '\0';
    (machine.cia)->keys_last_known_state[0x2d] = puVar6[0xe] != '\0';
    (machine.cia)->keys_last_known_state[0x2e] = puVar6[0xf] != '\0';
    (machine.cia)->keys_last_known_state[0x2f] = puVar6[0x33] != '\0';
    (machine.cia)->keys_last_known_state[0x30] = puVar6[0x34] != '\0';
    (machine.cia)->keys_last_known_state[0x31] = puVar6[0x31] != '\0';
    (machine.cia)->keys_last_known_state[0x32] = puVar6[0xe1] != '\0';
    (machine.cia)->keys_last_known_state[0x33] = puVar6[0x1d] != '\0';
    (machine.cia)->keys_last_known_state[0x34] = puVar6[0x1b] != '\0';
    (machine.cia)->keys_last_known_state[0x35] = puVar6[6] != '\0';
    (machine.cia)->keys_last_known_state[0x36] = puVar6[0x19] != '\0';
    (machine.cia)->keys_last_known_state[0x37] = puVar6[5] != '\0';
    (machine.cia)->keys_last_known_state[0x38] = puVar6[0x11] != '\0';
    (machine.cia)->keys_last_known_state[0x39] = puVar6[0x10] != '\0';
    (machine.cia)->keys_last_known_state[0x3a] = puVar6[0x36] != '\0';
    (machine.cia)->keys_last_known_state[0x3b] = puVar6[0x37] != '\0';
    (machine.cia)->keys_last_known_state[0x3c] = puVar6[0x38] != '\0';
    (machine.cia)->keys_last_known_state[0x3d] = puVar6[0xe5] != '\0';
    (machine.cia)->keys_last_known_state[0x3e] = puVar6[0xe0] != '\0';
    (machine.cia)->keys_last_known_state[0x3f] = puVar6[0x2c] != '\0';
    (machine.cia)->keys_last_known_state[0x40] = puVar6[0xe4] != '\0';
    (machine.cia)->keys_last_known_state[0x41] = puVar6[0x50] != '\0';
    (machine.cia)->keys_last_known_state[0x42] = puVar6[0x52] != '\0';
    (machine.cia)->keys_last_known_state[0x43] = puVar6[0x51] != '\0';
    (machine.cia)->keys_last_known_state[0x44] = puVar6[0x4f] != '\0';
  }
  if (iVar8 == -1) {
    puts("[SDL] detected quit event");
  }
  return iVar8;
}

Assistant:

int E64::sdl2_process_events()
{
    int return_value = NO_EVENT;
    
    SDL_Event event;

    bool shift_pressed = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] | E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT];
    bool alt_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LALT]   | E64_sdl2_keyboard_state[SDL_SCANCODE_RALT];
    //bool gui_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LGUI]   | E64_sdl2_keyboard_state[SDL_SCANCODE_RGUI];

    while(SDL_PollEvent(&event))
    {
        switch(event.type)
        {
            case SDL_KEYDOWN:
                
                return_value = KEYPRESS_EVENT;          // default at keydown, may change to QUIT_EVENT
                
                if(event.key.keysym.sym == SDLK_F9)
                {
                    E64::sdl2_wait_until_f9_released();
			machine.toggle_mode();
                }
                else if( (event.key.keysym.sym == SDLK_f) && alt_pressed )
                {
                    E64::sdl2_wait_until_f_released();
                    host.video->toggle_fullscreen();
                }
                else if( (event.key.keysym.sym == SDLK_r) && alt_pressed )
                {
                    E64::sdl2_wait_until_r_released();
			machine.reset();
                    stats.reset();
                }
                else if( (event.key.keysym.sym == SDLK_q) && alt_pressed )
                {
                    E64::sdl2_wait_until_q_released();
                    return_value = QUIT_EVENT;
                }
                else if(machine.mode == RUNNING)
                {
                    if(event.key.keysym.sym == SDLK_F10)
                    {
			    machine.vicv->toggle_stats();
                    }
                }
                else if(machine.mode == MONITOR)
                {
                    switch(event.key.keysym.sym)
                    {
                        case SDLK_0:
                            monitor.tty->putchar(shift_pressed ? ')' : '0');
                            break;
                        case SDLK_1:
                            monitor.tty->putchar(shift_pressed ? '!' : '1');
                            break;
                        case SDLK_2:
                            monitor.tty->putchar(shift_pressed ? '@' : '2');
                            break;
                        case SDLK_3:
                            monitor.tty->putchar(shift_pressed ? '#' : '3');
                            break;
                        case SDLK_4:
                            monitor.tty->putchar(shift_pressed ? '$' : '4');
                            break;
                        case SDLK_5:
                            monitor.tty->putchar(shift_pressed ? '%' : '5');
                            break;
                        case SDLK_6:
                            monitor.tty->putchar(shift_pressed ? '^' : '6');
                            break;
                        case SDLK_7:
                            monitor.tty->putchar(shift_pressed ? '&' : '7');
                            break;
                        case SDLK_8:
                            monitor.tty->putchar(shift_pressed ? '*' : '8');
                            break;
                        case SDLK_9:
                            monitor.tty->putchar(shift_pressed ? '(' : '9');
                            break;
                        case SDLK_a:
                            monitor.tty->putchar(shift_pressed ? 'A' : 'a');
                            break;
                        case SDLK_b:
                            monitor.tty->putchar(shift_pressed ? 'B' : 'b');
                            break;
                        case SDLK_c:
                            monitor.tty->putchar(shift_pressed ? 'C' : 'c');
                            break;
                        case SDLK_d:
                            monitor.tty->putchar(shift_pressed ? 'D' : 'd');
                            break;
                        case SDLK_e:
                            monitor.tty->putchar(shift_pressed ? 'E' : 'e');
                            break;
                        case SDLK_f:
                            monitor.tty->putchar(shift_pressed ? 'F' : 'f');
                            break;
                        case SDLK_g:
                            monitor.tty->putchar(shift_pressed ? 'G' : 'g');
                            break;
                        case SDLK_h:
                            monitor.tty->putchar(shift_pressed ? 'H' : 'h');
                            break;
                        case SDLK_i:
                            monitor.tty->putchar(shift_pressed ? 'I' : 'i');
                            break;
                        case SDLK_j:
                            monitor.tty->putchar(shift_pressed ? 'J' : 'j');
                            break;
                        case SDLK_k:
                            monitor.tty->putchar(shift_pressed ? 'K' : 'k');
                            break;
                        case SDLK_l:
                            monitor.tty->putchar(shift_pressed ? 'L' : 'l');
                            break;
                        case SDLK_m:
                            monitor.tty->putchar(shift_pressed ? 'M' : 'm');
                            break;
                        case SDLK_n:
                            monitor.tty->putchar(shift_pressed ? 'N' : 'n');
                            break;
                        case SDLK_o:
                            monitor.tty->putchar(shift_pressed ? 'O' : 'o');
                            break;
                        case SDLK_p:
                            monitor.tty->putchar(shift_pressed ? 'P' : 'p');
                            break;
                        case SDLK_q:
                            monitor.tty->putchar(shift_pressed ? 'Q' : 'q');
                            break;
                        case SDLK_r:
                            monitor.tty->putchar(shift_pressed ? 'R' : 'r');
                            break;
                        case SDLK_s:
                            monitor.tty->putchar(shift_pressed ? 'S' : 's');
                            break;
                        case SDLK_t:
                            monitor.tty->putchar(shift_pressed ? 'T' : 't');
                            break;
                        case SDLK_u:
                            monitor.tty->putchar(shift_pressed ? 'U' : 'u');
                            break;
                        case SDLK_v:
                            monitor.tty->putchar(shift_pressed ? 'V' : 'v');
                            break;
                        case SDLK_w:
                            monitor.tty->putchar(shift_pressed ? 'W' : 'w');
                            break;
                        case SDLK_x:
                            monitor.tty->putchar(shift_pressed ? 'X' : 'x');
                            break;
                        case SDLK_y:
                            monitor.tty->putchar(shift_pressed ? 'Y' : 'y');
                            break;
                        case SDLK_z:
                            monitor.tty->putchar(shift_pressed ? 'Z' : 'z');
                            break;
                        case SDLK_SPACE:
                            monitor.tty->putchar(' ');
                            break;
                        case SDLK_BACKQUOTE:
                            monitor.tty->putchar(shift_pressed ? '~' : '`');
                            break;
                        case SDLK_COMMA:
                            monitor.tty->putchar(shift_pressed ? '<' : ',');
                            break;
                        case SDLK_PERIOD:
                            monitor.tty->putchar(shift_pressed ? '>' : '.');
                            break;
                        case SDLK_SLASH:
                            monitor.tty->putchar(shift_pressed ? '?' : '/');
                            break;
                        case SDLK_SEMICOLON:
                            monitor.tty->putchar(shift_pressed ? ':' : ';');
                            break;
                        case SDLK_QUOTE:
                            monitor.tty->putchar(shift_pressed ? '"' : '\'');
                            break;
                        case SDLK_BACKSLASH:
                            monitor.tty->putchar(shift_pressed ? '|' : '\\');
                            break;
                        case SDLK_LEFTBRACKET:
                            monitor.tty->putchar(shift_pressed ? '{' : '[');
                            break;
                        case SDLK_RIGHTBRACKET:
                            monitor.tty->putchar(shift_pressed ? '}' : ']');
                            break;
                        case SDLK_MINUS:
                            monitor.tty->putchar(shift_pressed ? '_' : '-');
                            break;
                        case SDLK_EQUALS:
                            monitor.tty->putchar(shift_pressed ? '+' : '=');
                            break;
                        case SDLK_RETURN:
				    monitor.tty->enter();
                            break;
                        case SDLK_BACKSPACE:
                            if(shift_pressed)
                            {
				    monitor.tty->insert();
                            }
                            else
                            {
				    monitor.tty->backspace();
                            }
                            break;
                        case SDLK_LEFT:
				    monitor.tty->arrow_left();
                            break;
                        case SDLK_RIGHT:
				    monitor.tty->arrow_right();
                            break;
                        case SDLK_UP:
				    monitor.tty->arrow_up();
                            break;
                        case SDLK_DOWN:
				    monitor.tty->arrow_down();
                            break;
                        case SDLK_F1:
				    monitor.command->single_step_cpu();
                            if (monitor.tty->status_bar_active == false) {
				    monitor.tty->cursor_deactivate();
				    monitor.command->dump_cpu_status();
				    monitor.tty->prompt();
				    monitor.tty->cursor_activate();
                            }
                            break;
                        case SDLK_F2:
				    monitor.tty->toggle_status_bar();
                            break;
                        case SDLK_F3:
				    monitor.tty->status_bar_hex_view = !monitor.tty->status_bar_hex_view;
                            break;
                    }
                }
                break;
            case SDL_WINDOWEVENT:
                if(event.window.event == SDL_WINDOWEVENT_RESIZED)
                {
                    printf("[SDL] window resize event\n");
                }
                break;
            case SDL_DROPFILE:
			machine.fd->insert_disk(event.drop.file, false, false);
                SDL_free(event.drop.file);
		break;
            case SDL_QUIT:
                return_value = QUIT_EVENT;
                break;
        }
    }

    // update keystates in cia chip, regardless if machine is in debug or running mode
    if( !alt_pressed )
    {
	    machine.cia->keys_last_known_state[SCANCODE_ESCAPE] = E64_sdl2_keyboard_state[SDL_SCANCODE_ESCAPE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F1] = E64_sdl2_keyboard_state[SDL_SCANCODE_F1] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F2] = E64_sdl2_keyboard_state[SDL_SCANCODE_F2] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F3] = E64_sdl2_keyboard_state[SDL_SCANCODE_F3] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F4] = E64_sdl2_keyboard_state[SDL_SCANCODE_F4] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F5] = E64_sdl2_keyboard_state[SDL_SCANCODE_F5] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F6] = E64_sdl2_keyboard_state[SDL_SCANCODE_F6] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F7] = E64_sdl2_keyboard_state[SDL_SCANCODE_F7] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F8] = E64_sdl2_keyboard_state[SDL_SCANCODE_F8] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_GRAVE] = (machine.cia->registers[SCANCODE_GRAVE] << 1) | (E64_sdl2_keyboard_state[SDL_SCANCODE_GRAVE] ? 0x01 : 0x00);
	    machine.cia->keys_last_known_state[SCANCODE_1] = E64_sdl2_keyboard_state[SDL_SCANCODE_1] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_2] = E64_sdl2_keyboard_state[SDL_SCANCODE_2] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_3] = E64_sdl2_keyboard_state[SDL_SCANCODE_3] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_4] = E64_sdl2_keyboard_state[SDL_SCANCODE_4] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_5] = E64_sdl2_keyboard_state[SDL_SCANCODE_5] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_6] = E64_sdl2_keyboard_state[SDL_SCANCODE_6] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_7] = E64_sdl2_keyboard_state[SDL_SCANCODE_7] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_8] = E64_sdl2_keyboard_state[SDL_SCANCODE_8] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_9] = E64_sdl2_keyboard_state[SDL_SCANCODE_9] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_0] = E64_sdl2_keyboard_state[SDL_SCANCODE_0] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_MINUS] = E64_sdl2_keyboard_state[SDL_SCANCODE_MINUS] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_EQUALS] = E64_sdl2_keyboard_state[SDL_SCANCODE_EQUALS] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_BACKSPACE] = E64_sdl2_keyboard_state[SDL_SCANCODE_BACKSPACE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_TAB] = E64_sdl2_keyboard_state[SDL_SCANCODE_TAB] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Q] = E64_sdl2_keyboard_state[SDL_SCANCODE_Q] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_W] = E64_sdl2_keyboard_state[SDL_SCANCODE_W] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_E] = E64_sdl2_keyboard_state[SDL_SCANCODE_E] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_R] = E64_sdl2_keyboard_state[SDL_SCANCODE_R] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_T] = E64_sdl2_keyboard_state[SDL_SCANCODE_T] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Y] = E64_sdl2_keyboard_state[SDL_SCANCODE_Y] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_U] = E64_sdl2_keyboard_state[SDL_SCANCODE_U] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_I] = E64_sdl2_keyboard_state[SDL_SCANCODE_I] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_O] = E64_sdl2_keyboard_state[SDL_SCANCODE_O] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_P] = E64_sdl2_keyboard_state[SDL_SCANCODE_P] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LEFTBRACKET] = E64_sdl2_keyboard_state[SDL_SCANCODE_LEFTBRACKET] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RIGHTBRACKET] = E64_sdl2_keyboard_state[SDL_SCANCODE_RIGHTBRACKET] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RETURN] = E64_sdl2_keyboard_state[SDL_SCANCODE_RETURN] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_A] = E64_sdl2_keyboard_state[SDL_SCANCODE_A] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_S] = E64_sdl2_keyboard_state[SDL_SCANCODE_S] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_D] = E64_sdl2_keyboard_state[SDL_SCANCODE_D] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F] = E64_sdl2_keyboard_state[SDL_SCANCODE_F] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_G] = E64_sdl2_keyboard_state[SDL_SCANCODE_G] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_H] = E64_sdl2_keyboard_state[SDL_SCANCODE_H] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_J] = E64_sdl2_keyboard_state[SDL_SCANCODE_J] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_K] = E64_sdl2_keyboard_state[SDL_SCANCODE_K] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_L] = E64_sdl2_keyboard_state[SDL_SCANCODE_L] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SEMICOLON] = E64_sdl2_keyboard_state[SDL_SCANCODE_SEMICOLON] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_APOSTROPHE] = E64_sdl2_keyboard_state[SDL_SCANCODE_APOSTROPHE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_BACKSLASH] = E64_sdl2_keyboard_state[SDL_SCANCODE_BACKSLASH] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LSHIFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Z] = E64_sdl2_keyboard_state[SDL_SCANCODE_Z] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_X] = E64_sdl2_keyboard_state[SDL_SCANCODE_X] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_C] = E64_sdl2_keyboard_state[SDL_SCANCODE_C] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_V] = E64_sdl2_keyboard_state[SDL_SCANCODE_V] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_B] = E64_sdl2_keyboard_state[SDL_SCANCODE_B] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_N] = E64_sdl2_keyboard_state[SDL_SCANCODE_N] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_M] = E64_sdl2_keyboard_state[SDL_SCANCODE_M] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_COMMA] = E64_sdl2_keyboard_state[SDL_SCANCODE_COMMA] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_PERIOD] = E64_sdl2_keyboard_state[SDL_SCANCODE_PERIOD] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SLASH] = E64_sdl2_keyboard_state[SDL_SCANCODE_SLASH] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RSHIFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LCTRL] = E64_sdl2_keyboard_state[SDL_SCANCODE_LCTRL] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SPACE] = E64_sdl2_keyboard_state[SDL_SCANCODE_SPACE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RCTRL] = E64_sdl2_keyboard_state[SDL_SCANCODE_RCTRL] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LEFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_LEFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_UP] = E64_sdl2_keyboard_state[SDL_SCANCODE_UP] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_DOWN] = E64_sdl2_keyboard_state[SDL_SCANCODE_DOWN] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RIGHT] = E64_sdl2_keyboard_state[SDL_SCANCODE_RIGHT] ? 0x01 : 0x00;
	}
	if (return_value == QUIT_EVENT)
		printf("[SDL] detected quit event\n");
	return return_value;
}